

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

SNMP_PACKET_PARSE_ERROR __thiscall SNMPPacket::parseFrom(SNMPPacket *this,uchar *buf,size_t max_len)

{
  ComplexType *this_00;
  SNMP_BUFFER_PARSE_ERROR decodePacket;
  size_t max_len_local;
  uchar *buf_local;
  SNMPPacket *this_local;
  
  if (*buf == '0') {
    this_00 = (ComplexType *)operator_new(0x28);
    ComplexType::ComplexType(this_00,STRUCTURE);
    this->packet = this_00;
    this_local._4_4_ =
         (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[4])(this->packet,buf,max_len);
    if (0 < this_local._4_4_) {
      this_local._4_4_ = parsePacket(this,this->packet,SNMPVERSION);
    }
  }
  else {
    this_local._4_4_ = -0x16;
  }
  return this_local._4_4_;
}

Assistant:

SNMP_PACKET_PARSE_ERROR SNMPPacket::parseFrom(unsigned char* buf, size_t max_len){
    SNMP_LOGD("Parsing %ld bytes\n", max_len);
    if(buf[0] != 0x30) {
        SNMP_LOGD("First byte error\n");
        return SNMP_PARSE_ERROR_MAGIC_BYTE;
    }

    packet = new ComplexType(STRUCTURE);

    SNMP_BUFFER_PARSE_ERROR decodePacket = packet->fromBuffer(buf, max_len);
    if(decodePacket <= 0){
        SNMP_LOGD("failed to fromBuffer\n");
        return decodePacket;
    }

    // we now have a full ASN.1 packet in SNMPPacket
    return parsePacket(packet, SNMPVERSION);
}